

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O2

Gia_ObjEra_t * Gia_ManEraCreateState(Gia_ManEra_t *p)

{
  Vec_Ptr_t *p_00;
  Gia_ObjEra_t *Entry;
  
  Entry = (Gia_ObjEra_t *)Mem_FixedEntryFetch(p->pMemory);
  p_00 = p->vStates;
  Entry->Num = p_00->nSize;
  Entry->iPrev = 0;
  Vec_PtrPush(p_00,Entry);
  return Entry;
}

Assistant:

Gia_ObjEra_t * Gia_ManEraCreateState( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pNew;
    pNew = (Gia_ObjEra_t *)Mem_FixedEntryFetch( p->pMemory );
    pNew->Num = Vec_PtrSize( p->vStates );
    pNew->iPrev = 0;
    Vec_PtrPush( p->vStates, pNew );
    return pNew;
}